

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExporter.cpp
# Opt level: O1

aiNode * get_node_for_mesh(uint meshIndex,aiNode *node)

{
  ulong uVar1;
  uint uVar2;
  aiNode **ppaVar3;
  long lVar4;
  aiNode *paVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  
  uVar7 = (ulong)node->mNumMeshes;
  bVar8 = uVar7 != 0;
  if (bVar8) {
    if (*node->mMeshes != meshIndex) {
      uVar6 = 0;
      do {
        if (uVar7 - 1 == uVar6) goto LAB_00349c2e;
        uVar1 = uVar6 + 1;
        lVar4 = uVar6 + 1;
        uVar6 = uVar1;
      } while (node->mMeshes[lVar4] != meshIndex);
      bVar8 = uVar1 < uVar7;
    }
    if (bVar8) {
      return node;
    }
  }
LAB_00349c2e:
  uVar2 = node->mNumChildren;
  if ((ulong)uVar2 != 0) {
    ppaVar3 = node->mChildren;
    uVar7 = 0;
    do {
      paVar5 = get_node_for_mesh(meshIndex,ppaVar3[uVar7]);
      if (paVar5 != (aiNode *)0x0) {
        return paVar5;
      }
      uVar7 = uVar7 + 1;
    } while (uVar2 != uVar7);
  }
  return (aiNode *)0x0;
}

Assistant:

aiNode* get_node_for_mesh(unsigned int meshIndex, aiNode* node)
{
    for (size_t i = 0; i < node->mNumMeshes; ++i) {
        if (node->mMeshes[i] == meshIndex) {
            return node;
        }
    }
    for (size_t i = 0; i < node->mNumChildren; ++i) {
        aiNode* ret = get_node_for_mesh(meshIndex, node->mChildren[i]);
        if (ret) { return ret; }
    }
    return nullptr;
}